

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_assembler.c
# Opt level: O2

int parse_instruction_token(Context_conflict2 *ctx,Token token)

{
  char *__src;
  Token TVar1;
  int iVar2;
  int extraout_EAX;
  int iVar3;
  int extraout_EAX_00;
  undefined8 extraout_RAX;
  undefined8 uVar4;
  undefined8 extraout_RAX_00;
  uint uVar5;
  uint uVar6;
  size_t i;
  ulong uVar7;
  Instruction_conflict *pIVar8;
  uint uVar9;
  ulong uVar10;
  ulong uStack_70;
  uint32 controls;
  char opstr [32];
  
  TVar1 = token;
  if (token == 0x2b) {
    TVar1 = nexttoken(ctx);
  }
  if (TVar1 != TOKEN_IDENTIFIER) {
    fail(ctx,"Expected instruction");
    return extraout_EAX;
  }
  controls = 0;
  __src = ctx->token;
  uVar5 = ctx->tokenlen;
  iVar2 = shader_version_atleast(ctx,'\x01','\x04');
  if ((iVar2 == 0) && (iVar2 = check_token_segment(ctx,"TEX"), iVar2 != 0)) {
    controls = 0;
  }
  else {
    iVar2 = check_token_segment(ctx,"TEXLDP");
    if (iVar2 == 0) {
      iVar2 = check_token_segment(ctx,"TEXLDB");
      if (iVar2 == 0) {
        pIVar8 = instructions;
        for (uStack_70 = 0; uStack_70 != 0x61; uStack_70 = uStack_70 + 1) {
          if ((pIVar8->opcode_string != (char *)0x0) &&
             (iVar2 = check_token_segment(ctx,pIVar8->opcode_string), iVar2 != 0)) {
            if ((ctx->tokenlen == 0) || (*ctx->token == '_')) {
              uVar6 = (uint)uStack_70;
              if (uVar6 == 0x5e) {
                iVar2 = parse_condition(ctx,&controls);
                uStack_70 = 0x5e;
                if (iVar2 == 0) {
                  fail(ctx,"SETP requires a condition");
                  uStack_70 = 0x5e;
                }
                goto LAB_001373d9;
              }
              if (uVar6 == 0x2c) {
                iVar3 = parse_condition(ctx,&controls);
                iVar2 = 0x2d;
              }
              else {
                if (uVar6 != 0x28) {
                  if (uVar6 != 0x61) goto LAB_001373dc;
                  break;
                }
                iVar3 = parse_condition(ctx,&controls);
                iVar2 = 0x29;
              }
              uStack_70 = (ulong)(iVar2 - (uint)(iVar3 == 0));
              goto LAB_001373d9;
            }
            ctx->token = __src;
            ctx->tokenlen = uVar5;
          }
          pIVar8 = pIVar8 + 1;
        }
        goto LAB_0013753e;
      }
      controls = 2;
    }
    else {
      controls = 1;
    }
  }
  uStack_70 = 0x42;
LAB_001373d9:
  uVar6 = (uint)uStack_70;
LAB_001373dc:
  if ((ctx->tokenlen == 0) || (*ctx->token == '_')) {
    ctx->tokenbufpos = 0;
    iVar2 = (*instructions[uStack_70].parse_args)(ctx);
    uVar7 = 0;
    iVar3 = shader_version_atleast(ctx,'\x02','\0');
    uVar9 = iVar2 - 1;
    uVar5 = (uVar9 & 0xf) << 0x18;
    if (iVar3 == 0) {
      uVar5 = 0;
    }
    output_token_noswap(ctx,(uint)(token == 0x2b) << 0x1e | uVar6 & 0xffff |
                            (controls & 0xff) << 0x10 | uVar5);
    uVar4 = extraout_RAX;
    uVar10 = (ulong)uVar9;
    if ((int)uVar9 < 1) {
      uVar10 = uVar7;
    }
    for (; uVar10 != uVar7; uVar7 = uVar7 + 1) {
      output_token_noswap(ctx,ctx->tokenbuf[uVar7]);
      uVar4 = extraout_RAX_00;
    }
    return (int)uVar4;
  }
LAB_0013753e:
  uVar6 = 0x1f;
  if ((int)uVar5 < 0x1f) {
    uVar6 = uVar5;
  }
  memcpy(opstr,__src,(long)(int)uVar6);
  opstr[(int)uVar6] = '\0';
  failf(ctx,"Unknown instruction \'%s\'",opstr);
  return extraout_EAX_00;
}

Assistant:

static int parse_instruction_token(Context *ctx, Token token)
{
    int coissue = 0;
    int predicated = 0;

    if (token == ((Token) '+'))
    {
        coissue = 1;
        token = nexttoken(ctx);
    } // if

    if (token != TOKEN_IDENTIFIER)
    {
        fail(ctx, "Expected instruction");
        return 0;
    } // if

    uint32 controls = 0;
    uint32 opcode = OPCODE_TEXLD;
    const char *origtoken = ctx->token;
    const unsigned int origtokenlen = ctx->tokenlen;

    // "TEX" is only meaningful in ps_1_1.
    if ((!shader_version_atleast(ctx, 1, 4)) && (check_token_segment(ctx, "TEX")))
        controls = 0;

    // This might need to be TEXLD instead of TEXLDP.
    else if (check_token_segment(ctx, "TEXLDP"))
        controls = CONTROL_TEXLDP;

    // This might need to be TEXLD instead of TEXLDB.
    else if (check_token_segment(ctx, "TEXLDB"))
        controls = CONTROL_TEXLDB;

    else  // find the instruction.
    {
        size_t i;
        for (i = 0; i < STATICARRAYLEN(instructions); i++)
        {
            const char *opcode_string = instructions[i].opcode_string;
            if (opcode_string == NULL)
                continue;  // skip this.
            else if (!check_token_segment(ctx, opcode_string))
                continue;  // not us.
            else if ((ctx->tokenlen > 0) && (*ctx->token != '_'))
            {
                ctx->token = origtoken;
                ctx->tokenlen = origtokenlen;
                continue;  // not the match: TEXLD when we wanted TEXLDL, etc.
            } // if

            break;  // found it!
        } // for

        opcode = (uint32) i;

        // This might need to be IFC instead of IF.
        if (opcode == OPCODE_IF)
        {
            if (parse_condition(ctx, &controls))
                opcode = OPCODE_IFC;
        } // if

        // This might need to be BREAKC instead of BREAK.
        else if (opcode == OPCODE_BREAK)
        {
            if (parse_condition(ctx, &controls))
                opcode = OPCODE_BREAKC;
        } // else if

        // SETP has a conditional code, always.
        else if (opcode == OPCODE_SETP)
        {
            if (!parse_condition(ctx, &controls))
                fail(ctx, "SETP requires a condition");
        } // else if
    } // else

    if ( (opcode == STATICARRAYLEN(instructions)) ||
         ((ctx->tokenlen > 0) && (ctx->token[0] != '_')) )
    {
        char opstr[32];
        const int len = Min(sizeof (opstr) - 1, origtokenlen);
        memcpy(opstr, origtoken, len);
        opstr[len] = '\0';
        failf(ctx, "Unknown instruction '%s'", opstr);
        return 0;
    } // if

    const Instruction *instruction = &instructions[opcode];

    // !!! FIXME: predicated instructions

    ctx->tokenbufpos = 0;

    const int tokcount = instruction->parse_args(ctx);

    // insttoks bits are reserved and should be zero if < SM2.
    const uint32 insttoks = shader_version_atleast(ctx, 2, 0) ? tokcount-1 : 0;

    // write out the instruction token.
    output_token(ctx, ((opcode & 0xFFFF) << 0) |
                      ((controls & 0xFF) << 16) |
                      ((insttoks & 0xF) << 24) |
                      ((coissue) ? 0x40000000 : 0x00000000) |
                      ((predicated) ? 0x10000000 : 0x00000000) );

    // write out the argument tokens.
    int i;
    for (i = 0; i < (tokcount-1); i++)
        output_token(ctx, ctx->tokenbuf[i]);

    return 1;
}